

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
cppqc::detail::ChooseStatelessGenerator<int>::shrink
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          ChooseStatelessGenerator<int> *this,int x)

{
  iterator iVar1;
  uint uVar2;
  uint uVar3;
  uint local_20;
  uint local_1c;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (__return_storage_ptr__,(long)x - (long)this->m_min);
  local_1c = this->m_min;
  local_20 = this->m_max;
  uVar2 = -local_1c;
  if (0 < (int)local_1c) {
    uVar2 = local_1c;
  }
  uVar3 = -local_20;
  if (0 < (int)local_20) {
    uVar3 = local_20;
  }
  if (uVar3 < uVar2) {
    if (local_20 != x) {
      do {
        iVar1._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar1,
                     (int *)&local_20);
        }
        else {
          *iVar1._M_current = local_20;
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        local_20 = local_20 - 1;
      } while (local_20 != x);
    }
  }
  else if (local_1c != x) {
    do {
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar1,(int *)&local_1c)
        ;
      }
      else {
        *iVar1._M_current = local_1c;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_1c = local_1c + 1;
    } while (local_1c != x);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Integer> shrink(Integer x) const {
    std::vector<Integer> ret;
    ret.reserve(x - m_min);
    if (abs(m_min) <= abs(m_max)) {
      for (Integer i = m_min; i != x; ++i)
        ret.push_back(i);
    } else {
      for (Integer i = m_max; i != x; --i)
        ret.push_back(i);
    }
    return ret;
  }